

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableServiceGenerator::Generate
          (ImmutableServiceGenerator *this,Printer *printer)

{
  ServiceDescriptor *pSVar1;
  Context *context;
  Printer *pPVar2;
  Options *pOVar3;
  FileDescriptor *descriptor;
  char *pcVar4;
  int __c;
  AlphaNum *a;
  ClassNameResolver *this_00;
  string_view local_1b0;
  string_view local_1a0;
  string_view local_190;
  AlphaNum local_180;
  string local_150;
  string local_130;
  string_view local_110;
  string_view local_100;
  string_view local_f0;
  string_view local_e0;
  char *local_d0;
  string_view local_c8;
  string_view local_b8;
  allocator<char> local_a1;
  string local_a0;
  Options local_70;
  byte local_19;
  Printer *pPStack_18;
  bool is_own_file;
  Printer *printer_local;
  ImmutableServiceGenerator *this_local;
  
  pPStack_18 = printer;
  printer_local = (Printer *)this;
  local_19 = IsOwnFile<google::protobuf::ServiceDescriptor>
                       ((this->super_ServiceGenerator).descriptor_,true);
  pPVar2 = pPStack_18;
  pSVar1 = (this->super_ServiceGenerator).descriptor_;
  pOVar3 = Context::options(this->context_);
  Options::Options(&local_70,pOVar3);
  WriteServiceDocComment(pPVar2,pSVar1,&local_70);
  Options::~Options(&local_70);
  pPVar2 = pPStack_18;
  pSVar1 = (this->super_ServiceGenerator).descriptor_;
  context = this->context_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,anon_var_dwarf_37cdd0 + 5,&local_a1);
  MaybePrintGeneratedAnnotation<google::protobuf::ServiceDescriptor_const>
            (context,pPVar2,pSVar1,true,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  pOVar3 = Context::options(this->context_);
  pPVar2 = pPStack_18;
  if ((pOVar3->opensource_runtime & 1U) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_b8,"@com.google.protobuf.Internal.ProtoNonnullApi\n");
    protobuf::io::Printer::Print<>(pPVar2,local_b8);
  }
  pPVar2 = pPStack_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c8,
             "public $static$ abstract class $classname$\n    implements com.google.protobuf.Service {\n"
            );
  local_d0 = "static";
  if ((local_19 & 1) != 0) {
    local_d0 = anon_var_dwarf_37cdd0 + 5;
  }
  local_e0 = ServiceDescriptor::name((this->super_ServiceGenerator).descriptor_);
  protobuf::io::Printer::
  Print<char[7],char_const*,char[10],std::basic_string_view<char,std::char_traits<char>>>
            (pPVar2,local_c8,(char (*) [7])"static",&local_d0,(char (*) [10])0x1fb9081,&local_e0);
  protobuf::io::Printer::Indent(pPStack_18);
  pPVar2 = pPStack_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_f0,"protected $classname$() {}\n\n");
  local_100 = ServiceDescriptor::name((this->super_ServiceGenerator).descriptor_);
  protobuf::io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (pPVar2,local_f0,(char (*) [10])0x1fb9081,&local_100);
  GenerateInterface(this,pPStack_18);
  GenerateNewReflectiveServiceMethod(this,pPStack_18);
  GenerateNewReflectiveBlockingServiceMethod(this,pPStack_18);
  GenerateAbstractMethods(this,pPStack_18);
  pPVar2 = pPStack_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_110,
             "public static final\n    com.google.protobuf.Descriptors.ServiceDescriptor\n    getDescriptor() {\n  return $file$.getDescriptor().getServices().get($index$);\n}\n"
            );
  this_00 = this->name_resolver_;
  descriptor = ServiceDescriptor::file((this->super_ServiceGenerator).descriptor_);
  ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
            (&local_130,this_00,descriptor);
  pcVar4 = ServiceDescriptor::index((this->super_ServiceGenerator).descriptor_,(char *)this_00,__c);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_180,(int)pcVar4);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_150,(lts_20250127 *)&local_180,a);
  protobuf::io::Printer::Print<char[5],std::__cxx11::string,char[6],std::__cxx11::string>
            (pPVar2,local_110,(char (*) [5])0x1eed29c,&local_130,(char (*) [6])0x1d2f5b9,&local_150)
  ;
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  GenerateGetDescriptorForType(this,pPStack_18);
  GenerateCallMethod(this,pPStack_18);
  GenerateGetPrototype(this,REQUEST,pPStack_18);
  GenerateGetPrototype(this,RESPONSE,pPStack_18);
  GenerateStub(this,pPStack_18);
  GenerateBlockingStub(this,pPStack_18);
  pPVar2 = pPStack_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_190,"\n// @@protoc_insertion_point(class_scope:$full_name$)\n");
  local_1a0 = ServiceDescriptor::full_name((this->super_ServiceGenerator).descriptor_);
  protobuf::io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (pPVar2,local_190,(char (*) [10])0x208afb9,&local_1a0);
  protobuf::io::Printer::Outdent(pPStack_18);
  pPVar2 = pPStack_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1b0,"}\n\n");
  protobuf::io::Printer::Print<>(pPVar2,local_1b0);
  return;
}

Assistant:

void ImmutableServiceGenerator::Generate(io::Printer* printer) {
  bool is_own_file = IsOwnFile(descriptor_, /* immutable = */ true);
  WriteServiceDocComment(printer, descriptor_, context_->options());
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true);
  if (!context_->options().opensource_runtime) {
    printer->Print("@com.google.protobuf.Internal.ProtoNonnullApi\n");
  }

  printer->Print(
      "public $static$ abstract class $classname$\n"
      "    implements com.google.protobuf.Service {\n",
      "static", is_own_file ? "" : "static", "classname", descriptor_->name());
  printer->Indent();

  printer->Print("protected $classname$() {}\n\n", "classname",
                 descriptor_->name());

  GenerateInterface(printer);

  GenerateNewReflectiveServiceMethod(printer);
  GenerateNewReflectiveBlockingServiceMethod(printer);

  GenerateAbstractMethods(printer);

  // Generate getDescriptor() and getDescriptorForType().
  printer->Print(
      "public static final\n"
      "    com.google.protobuf.Descriptors.ServiceDescriptor\n"
      "    getDescriptor() {\n"
      "  return $file$.getDescriptor().getServices().get($index$);\n"
      "}\n",
      "file", name_resolver_->GetImmutableClassName(descriptor_->file()),
      "index", absl::StrCat(descriptor_->index()));
  GenerateGetDescriptorForType(printer);

  // Generate more stuff.
  GenerateCallMethod(printer);
  GenerateGetPrototype(REQUEST, printer);
  GenerateGetPrototype(RESPONSE, printer);
  GenerateStub(printer);
  GenerateBlockingStub(printer);

  // Add an insertion point.
  printer->Print(
      "\n"
      "// @@protoc_insertion_point(class_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n\n");
}